

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  U32 UVar12;
  U32 UVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t sVar17;
  size_t sVar18;
  U64 UVar19;
  U64 UVar20;
  bool bVar21;
  uint local_d04;
  uint local_d00;
  uint local_bbc;
  uint local_bb8;
  uint local_a74;
  uint local_a70;
  uint local_92c;
  uint local_928;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_760;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_710;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 current_3;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_6c8;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_660;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  BYTE *pBStack_638;
  U32 prefixLowestIndex_3;
  BYTE *anchor_3;
  BYTE *ip_3;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_578;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_528;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 current_2;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_4e0;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_478;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  BYTE *pBStack_450;
  U32 prefixLowestIndex_2;
  BYTE *anchor_2;
  BYTE *ip_2;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_390;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_340;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 current_1;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_2f8;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_290;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  BYTE *pBStack_268;
  U32 prefixLowestIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  BYTE *dictMatchL3;
  BYTE *pBStack_1a8;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_158;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 current;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_110;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_a8;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  BYTE *pBStack_80;
  U32 prefixLowestIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  
  iVar9 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar14 = pBVar8 + uVar3;
    pBVar15 = (BYTE *)((long)src + srcSize);
    pBVar16 = pBVar15 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    dms._4_4_ = 0;
    anchor = (BYTE *)((long)src + (long)(int)(uint)(iVar9 == (int)pBVar14));
    uVar11 = (int)anchor - (int)pBVar14;
    local_a8 = uVar5;
    if (uVar11 < uVar5) {
      local_a8 = 0;
      dms._4_4_ = uVar5;
    }
    offsetSaved = uVar4;
    pBStack_80 = (BYTE *)src;
    if (uVar11 < uVar4) {
      offsetSaved = 0;
      dms._4_4_ = uVar4;
    }
    while (anchor < pBVar16) {
      sVar17 = ZSTD_hashPtr(anchor,UVar1,8);
      sVar18 = ZSTD_hashPtr(anchor,UVar2,4);
      ZSTD_hashPtr(anchor,UVar1,8);
      ZSTD_hashPtr(anchor,UVar2,4);
      iVar10 = (int)pBVar8;
      iVar9 = (int)anchor;
      uVar11 = iVar9 - iVar10;
      uVar4 = pUVar6[sVar17];
      uVar5 = pUVar7[sVar18];
      match = pBVar8 + uVar4;
      pBStack_158 = pBVar8 + uVar5;
      pUVar7[sVar18] = uVar11;
      pUVar6[sVar17] = uVar11;
      UVar12 = MEM_read32(anchor + (1 - (ulong)offsetSaved));
      UVar13 = MEM_read32(anchor + 1);
      if (offsetSaved == 0 || UVar12 != UVar13) {
        if (uVar3 < uVar4) {
          UVar19 = MEM_read64(match);
          UVar20 = MEM_read64(anchor);
          if (UVar19 != UVar20) goto LAB_0071bbab;
          sVar17 = ZSTD_count(anchor + 8,match + 8,pBVar15);
          lStack_110 = sVar17 + 8;
          h2._4_4_ = iVar9 - (int)match;
          while( true ) {
            bVar21 = false;
            if (pBStack_80 < anchor && pBVar14 < match) {
              bVar21 = anchor[-1] == match[-1];
            }
            if (!bVar21) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_110 = lStack_110 + 1;
          }
LAB_0071c17f:
          local_a8 = offsetSaved;
          offsetSaved = h2._4_4_;
          ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_80,pBStack_80,h2._4_4_ + 2,
                        lStack_110 - 3);
          goto LAB_0071c1c3;
        }
LAB_0071bbab:
        if (uVar3 < uVar5) {
          UVar12 = MEM_read32(pBStack_158);
          UVar13 = MEM_read32(anchor);
          if (UVar12 == UVar13) {
            sVar17 = ZSTD_hashPtr(anchor + 1,UVar1,8);
            ZSTD_hashPtr(anchor + 1,UVar1,8);
            uVar4 = pUVar6[sVar17];
            pBStack_1a8 = pBVar8 + uVar4;
            pUVar6[sVar17] = uVar11 + 1;
            if (uVar3 < uVar4) {
              UVar19 = MEM_read64(pBStack_1a8);
              UVar20 = MEM_read64(anchor + 1);
              if (UVar19 == UVar20) {
                sVar17 = ZSTD_count(anchor + 9,pBStack_1a8 + 8,pBVar15);
                lStack_110 = sVar17 + 8;
                anchor = anchor + 1;
                h2._4_4_ = (int)anchor - (int)pBStack_1a8;
                while( true ) {
                  bVar21 = false;
                  if (pBStack_80 < anchor && pBVar14 < pBStack_1a8) {
                    bVar21 = anchor[-1] == pBStack_1a8[-1];
                  }
                  if (!bVar21) break;
                  anchor = anchor + -1;
                  pBStack_1a8 = pBStack_1a8 + -1;
                  lStack_110 = lStack_110 + 1;
                }
                goto LAB_0071c17f;
              }
            }
            sVar17 = ZSTD_count(anchor + 4,pBStack_158 + 4,pBVar15);
            lStack_110 = sVar17 + 4;
            h2._4_4_ = iVar9 - (int)pBStack_158;
            while( true ) {
              bVar21 = false;
              if (pBStack_80 < anchor && pBVar14 < pBStack_158) {
                bVar21 = anchor[-1] == pBStack_158[-1];
              }
              if (!bVar21) break;
              anchor = anchor + -1;
              pBStack_158 = pBStack_158 + -1;
              lStack_110 = lStack_110 + 1;
            }
            goto LAB_0071c17f;
          }
        }
        anchor = anchor + ((long)anchor - (long)pBStack_80 >> 8) + 1;
      }
      else {
        sVar17 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)offsetSaved),pBVar15);
        lStack_110 = sVar17 + 4;
        anchor = anchor + 1;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_80,pBStack_80,0,sVar17 + 1);
LAB_0071c1c3:
        pBStack_80 = anchor + lStack_110;
        anchor = pBStack_80;
        if (pBStack_80 <= pBVar16) {
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar2,4);
          pUVar7[sVar17] = uVar11 + 2;
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar1,8);
          pUVar6[sVar17] = uVar11 + 2;
          UVar12 = ((int)pBStack_80 + -2) - iVar10;
          sVar17 = ZSTD_hashPtr(pBStack_80 + -2,UVar2,4);
          pUVar7[sVar17] = UVar12;
          sVar17 = ZSTD_hashPtr(pBStack_80 + -2,UVar1,8);
          pUVar6[sVar17] = UVar12;
          while( true ) {
            uVar4 = local_a8;
            bVar21 = false;
            if (anchor <= pBVar16) {
              UVar12 = MEM_read32(anchor);
              UVar13 = MEM_read32(anchor + -(ulong)local_a8);
              bVar21 = local_a8 != 0 && UVar12 == UVar13;
            }
            pBStack_80 = anchor;
            if (!bVar21) break;
            sVar17 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)local_a8),pBVar15);
            local_a8 = offsetSaved;
            offsetSaved = uVar4;
            sVar18 = ZSTD_hashPtr(anchor,UVar2,4);
            pUVar7[sVar18] = (int)anchor - iVar10;
            sVar18 = ZSTD_hashPtr(anchor,UVar1,8);
            pUVar6[sVar18] = (int)anchor - iVar10;
            ZSTD_storeSeq(seqStore,0,anchor,0,sVar17 + 1);
            anchor = anchor + sVar17 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_928 = dms._4_4_;
    }
    else {
      local_928 = offsetSaved;
    }
    *rep = local_928;
    if (local_a8 == 0) {
      local_92c = dms._4_4_;
    }
    else {
      local_92c = local_a8;
    }
    rep[1] = local_92c;
    ms_local = (ZSTD_matchState_t *)(pBVar15 + -(long)pBStack_80);
    break;
  case 5:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar14 = pBVar8 + uVar3;
    pBVar15 = (BYTE *)((long)src + srcSize);
    pBVar16 = pBVar15 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    dms_1._4_4_ = 0;
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar9 == (int)pBVar14));
    uVar11 = (int)anchor_1 - (int)pBVar14;
    local_290 = uVar5;
    if (uVar11 < uVar5) {
      local_290 = 0;
      dms_1._4_4_ = uVar5;
    }
    offsetSaved_1 = uVar4;
    pBStack_268 = (BYTE *)src;
    if (uVar11 < uVar4) {
      offsetSaved_1 = 0;
      dms_1._4_4_ = uVar4;
    }
    while (anchor_1 < pBVar16) {
      sVar17 = ZSTD_hashPtr(anchor_1,UVar1,8);
      sVar18 = ZSTD_hashPtr(anchor_1,UVar2,5);
      ZSTD_hashPtr(anchor_1,UVar1,8);
      ZSTD_hashPtr(anchor_1,UVar2,5);
      iVar10 = (int)pBVar8;
      iVar9 = (int)anchor_1;
      uVar11 = iVar9 - iVar10;
      uVar4 = pUVar6[sVar17];
      uVar5 = pUVar7[sVar18];
      match_1 = pBVar8 + uVar4;
      pBStack_340 = pBVar8 + uVar5;
      pUVar7[sVar18] = uVar11;
      pUVar6[sVar17] = uVar11;
      UVar12 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved_1));
      UVar13 = MEM_read32(anchor_1 + 1);
      if (offsetSaved_1 == 0 || UVar12 != UVar13) {
        if (uVar3 < uVar4) {
          UVar19 = MEM_read64(match_1);
          UVar20 = MEM_read64(anchor_1);
          if (UVar19 != UVar20) goto LAB_0071d201;
          sVar17 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar15);
          lStack_2f8 = sVar17 + 8;
          h2_1._4_4_ = iVar9 - (int)match_1;
          while( true ) {
            bVar21 = false;
            if (pBStack_268 < anchor_1 && pBVar14 < match_1) {
              bVar21 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar21) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_2f8 = lStack_2f8 + 1;
          }
LAB_0071d86b:
          local_290 = offsetSaved_1;
          offsetSaved_1 = h2_1._4_4_;
          ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_268,pBStack_268,h2_1._4_4_ + 2,
                        lStack_2f8 - 3);
          goto LAB_0071d8bb;
        }
LAB_0071d201:
        if (uVar3 < uVar5) {
          UVar12 = MEM_read32(pBStack_340);
          UVar13 = MEM_read32(anchor_1);
          if (UVar12 == UVar13) {
            sVar17 = ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            uVar4 = pUVar6[sVar17];
            pBStack_390 = pBVar8 + uVar4;
            pUVar6[sVar17] = uVar11 + 1;
            if (uVar3 < uVar4) {
              UVar19 = MEM_read64(pBStack_390);
              UVar20 = MEM_read64(anchor_1 + 1);
              if (UVar19 == UVar20) {
                sVar17 = ZSTD_count(anchor_1 + 9,pBStack_390 + 8,pBVar15);
                lStack_2f8 = sVar17 + 8;
                anchor_1 = anchor_1 + 1;
                h2_1._4_4_ = (int)anchor_1 - (int)pBStack_390;
                while( true ) {
                  bVar21 = false;
                  if (pBStack_268 < anchor_1 && pBVar14 < pBStack_390) {
                    bVar21 = anchor_1[-1] == pBStack_390[-1];
                  }
                  if (!bVar21) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_390 = pBStack_390 + -1;
                  lStack_2f8 = lStack_2f8 + 1;
                }
                goto LAB_0071d86b;
              }
            }
            sVar17 = ZSTD_count(anchor_1 + 4,pBStack_340 + 4,pBVar15);
            lStack_2f8 = sVar17 + 4;
            h2_1._4_4_ = iVar9 - (int)pBStack_340;
            while( true ) {
              bVar21 = false;
              if (pBStack_268 < anchor_1 && pBVar14 < pBStack_340) {
                bVar21 = anchor_1[-1] == pBStack_340[-1];
              }
              if (!bVar21) break;
              anchor_1 = anchor_1 + -1;
              pBStack_340 = pBStack_340 + -1;
              lStack_2f8 = lStack_2f8 + 1;
            }
            goto LAB_0071d86b;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_268 >> 8) + 1;
      }
      else {
        sVar17 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved_1),pBVar15);
        lStack_2f8 = sVar17 + 4;
        anchor_1 = anchor_1 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_268,pBStack_268,0,sVar17 + 1);
LAB_0071d8bb:
        pBStack_268 = anchor_1 + lStack_2f8;
        anchor_1 = pBStack_268;
        if (pBStack_268 <= pBVar16) {
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar2,5);
          pUVar7[sVar17] = uVar11 + 2;
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar1,8);
          pUVar6[sVar17] = uVar11 + 2;
          UVar12 = ((int)pBStack_268 + -2) - iVar10;
          sVar17 = ZSTD_hashPtr(pBStack_268 + -2,UVar2,5);
          pUVar7[sVar17] = UVar12;
          sVar17 = ZSTD_hashPtr(pBStack_268 + -2,UVar1,8);
          pUVar6[sVar17] = UVar12;
          while( true ) {
            uVar4 = local_290;
            bVar21 = false;
            if (anchor_1 <= pBVar16) {
              UVar12 = MEM_read32(anchor_1);
              UVar13 = MEM_read32(anchor_1 + -(ulong)local_290);
              bVar21 = local_290 != 0 && UVar12 == UVar13;
            }
            pBStack_268 = anchor_1;
            if (!bVar21) break;
            sVar17 = ZSTD_count(anchor_1 + 4,anchor_1 + (4 - (ulong)local_290),pBVar15);
            local_290 = offsetSaved_1;
            offsetSaved_1 = uVar4;
            sVar18 = ZSTD_hashPtr(anchor_1,UVar2,5);
            pUVar7[sVar18] = (int)anchor_1 - iVar10;
            sVar18 = ZSTD_hashPtr(anchor_1,UVar1,8);
            pUVar6[sVar18] = (int)anchor_1 - iVar10;
            ZSTD_storeSeq(seqStore,0,anchor_1,0,sVar17 + 1);
            anchor_1 = anchor_1 + sVar17 + 4;
          }
        }
      }
    }
    if (offsetSaved_1 == 0) {
      local_a70 = dms_1._4_4_;
    }
    else {
      local_a70 = offsetSaved_1;
    }
    *rep = local_a70;
    if (local_290 == 0) {
      local_a74 = dms_1._4_4_;
    }
    else {
      local_a74 = local_290;
    }
    rep[1] = local_a74;
    ms_local = (ZSTD_matchState_t *)(pBVar15 + -(long)pBStack_268);
    break;
  case 6:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar14 = pBVar8 + uVar3;
    pBVar15 = (BYTE *)((long)src + srcSize);
    pBVar16 = pBVar15 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    dms_2._4_4_ = 0;
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(iVar9 == (int)pBVar14));
    uVar11 = (int)anchor_2 - (int)pBVar14;
    local_478 = uVar5;
    if (uVar11 < uVar5) {
      local_478 = 0;
      dms_2._4_4_ = uVar5;
    }
    offsetSaved_2 = uVar4;
    pBStack_450 = (BYTE *)src;
    if (uVar11 < uVar4) {
      offsetSaved_2 = 0;
      dms_2._4_4_ = uVar4;
    }
    while (anchor_2 < pBVar16) {
      sVar17 = ZSTD_hashPtr(anchor_2,UVar1,8);
      sVar18 = ZSTD_hashPtr(anchor_2,UVar2,6);
      ZSTD_hashPtr(anchor_2,UVar1,8);
      ZSTD_hashPtr(anchor_2,UVar2,6);
      iVar10 = (int)pBVar8;
      iVar9 = (int)anchor_2;
      uVar11 = iVar9 - iVar10;
      uVar4 = pUVar6[sVar17];
      uVar5 = pUVar7[sVar18];
      match_2 = pBVar8 + uVar4;
      pBStack_528 = pBVar8 + uVar5;
      pUVar7[sVar18] = uVar11;
      pUVar6[sVar17] = uVar11;
      UVar12 = MEM_read32(anchor_2 + (1 - (ulong)offsetSaved_2));
      UVar13 = MEM_read32(anchor_2 + 1);
      if (offsetSaved_2 == 0 || UVar12 != UVar13) {
        if (uVar3 < uVar4) {
          UVar19 = MEM_read64(match_2);
          UVar20 = MEM_read64(anchor_2);
          if (UVar19 != UVar20) goto LAB_0071e9ce;
          sVar17 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar15);
          lStack_4e0 = sVar17 + 8;
          h2_2._4_4_ = iVar9 - (int)match_2;
          while( true ) {
            bVar21 = false;
            if (pBStack_450 < anchor_2 && pBVar14 < match_2) {
              bVar21 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar21) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_4e0 = lStack_4e0 + 1;
          }
LAB_0071f038:
          local_478 = offsetSaved_2;
          offsetSaved_2 = h2_2._4_4_;
          ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_450,pBStack_450,h2_2._4_4_ + 2,
                        lStack_4e0 - 3);
          goto LAB_0071f088;
        }
LAB_0071e9ce:
        if (uVar3 < uVar5) {
          UVar12 = MEM_read32(pBStack_528);
          UVar13 = MEM_read32(anchor_2);
          if (UVar12 == UVar13) {
            sVar17 = ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            uVar4 = pUVar6[sVar17];
            pBStack_578 = pBVar8 + uVar4;
            pUVar6[sVar17] = uVar11 + 1;
            if (uVar3 < uVar4) {
              UVar19 = MEM_read64(pBStack_578);
              UVar20 = MEM_read64(anchor_2 + 1);
              if (UVar19 == UVar20) {
                sVar17 = ZSTD_count(anchor_2 + 9,pBStack_578 + 8,pBVar15);
                lStack_4e0 = sVar17 + 8;
                anchor_2 = anchor_2 + 1;
                h2_2._4_4_ = (int)anchor_2 - (int)pBStack_578;
                while( true ) {
                  bVar21 = false;
                  if (pBStack_450 < anchor_2 && pBVar14 < pBStack_578) {
                    bVar21 = anchor_2[-1] == pBStack_578[-1];
                  }
                  if (!bVar21) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_578 = pBStack_578 + -1;
                  lStack_4e0 = lStack_4e0 + 1;
                }
                goto LAB_0071f038;
              }
            }
            sVar17 = ZSTD_count(anchor_2 + 4,pBStack_528 + 4,pBVar15);
            lStack_4e0 = sVar17 + 4;
            h2_2._4_4_ = iVar9 - (int)pBStack_528;
            while( true ) {
              bVar21 = false;
              if (pBStack_450 < anchor_2 && pBVar14 < pBStack_528) {
                bVar21 = anchor_2[-1] == pBStack_528[-1];
              }
              if (!bVar21) break;
              anchor_2 = anchor_2 + -1;
              pBStack_528 = pBStack_528 + -1;
              lStack_4e0 = lStack_4e0 + 1;
            }
            goto LAB_0071f038;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_450 >> 8) + 1;
      }
      else {
        sVar17 = ZSTD_count(anchor_2 + 5,anchor_2 + (5 - (ulong)offsetSaved_2),pBVar15);
        lStack_4e0 = sVar17 + 4;
        anchor_2 = anchor_2 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_450,pBStack_450,0,sVar17 + 1);
LAB_0071f088:
        pBStack_450 = anchor_2 + lStack_4e0;
        anchor_2 = pBStack_450;
        if (pBStack_450 <= pBVar16) {
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar2,6);
          pUVar7[sVar17] = uVar11 + 2;
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar1,8);
          pUVar6[sVar17] = uVar11 + 2;
          UVar12 = ((int)pBStack_450 + -2) - iVar10;
          sVar17 = ZSTD_hashPtr(pBStack_450 + -2,UVar2,6);
          pUVar7[sVar17] = UVar12;
          sVar17 = ZSTD_hashPtr(pBStack_450 + -2,UVar1,8);
          pUVar6[sVar17] = UVar12;
          while( true ) {
            uVar4 = local_478;
            bVar21 = false;
            if (anchor_2 <= pBVar16) {
              UVar12 = MEM_read32(anchor_2);
              UVar13 = MEM_read32(anchor_2 + -(ulong)local_478);
              bVar21 = local_478 != 0 && UVar12 == UVar13;
            }
            pBStack_450 = anchor_2;
            if (!bVar21) break;
            sVar17 = ZSTD_count(anchor_2 + 4,anchor_2 + (4 - (ulong)local_478),pBVar15);
            local_478 = offsetSaved_2;
            offsetSaved_2 = uVar4;
            sVar18 = ZSTD_hashPtr(anchor_2,UVar2,6);
            pUVar7[sVar18] = (int)anchor_2 - iVar10;
            sVar18 = ZSTD_hashPtr(anchor_2,UVar1,8);
            pUVar6[sVar18] = (int)anchor_2 - iVar10;
            ZSTD_storeSeq(seqStore,0,anchor_2,0,sVar17 + 1);
            anchor_2 = anchor_2 + sVar17 + 4;
          }
        }
      }
    }
    if (offsetSaved_2 == 0) {
      local_bb8 = dms_2._4_4_;
    }
    else {
      local_bb8 = offsetSaved_2;
    }
    *rep = local_bb8;
    if (local_478 == 0) {
      local_bbc = dms_2._4_4_;
    }
    else {
      local_bbc = local_478;
    }
    rep[1] = local_bbc;
    ms_local = (ZSTD_matchState_t *)(pBVar15 + -(long)pBStack_450);
    break;
  case 7:
    pUVar6 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar7 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar8 = (ms->window).base;
    uVar3 = (ms->window).dictLimit;
    pBVar14 = pBVar8 + uVar3;
    pBVar15 = (BYTE *)((long)src + srcSize);
    pBVar16 = pBVar15 + -8;
    uVar4 = *rep;
    uVar5 = rep[1];
    dms_3._4_4_ = 0;
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(iVar9 == (int)pBVar14));
    uVar11 = (int)anchor_3 - (int)pBVar14;
    local_660 = uVar5;
    if (uVar11 < uVar5) {
      local_660 = 0;
      dms_3._4_4_ = uVar5;
    }
    offsetSaved_3 = uVar4;
    pBStack_638 = (BYTE *)src;
    if (uVar11 < uVar4) {
      offsetSaved_3 = 0;
      dms_3._4_4_ = uVar4;
    }
    while (anchor_3 < pBVar16) {
      sVar17 = ZSTD_hashPtr(anchor_3,UVar1,8);
      sVar18 = ZSTD_hashPtr(anchor_3,UVar2,7);
      ZSTD_hashPtr(anchor_3,UVar1,8);
      ZSTD_hashPtr(anchor_3,UVar2,7);
      iVar10 = (int)pBVar8;
      iVar9 = (int)anchor_3;
      uVar11 = iVar9 - iVar10;
      uVar4 = pUVar6[sVar17];
      uVar5 = pUVar7[sVar18];
      match_3 = pBVar8 + uVar4;
      pBStack_710 = pBVar8 + uVar5;
      pUVar7[sVar18] = uVar11;
      pUVar6[sVar17] = uVar11;
      UVar12 = MEM_read32(anchor_3 + (1 - (ulong)offsetSaved_3));
      UVar13 = MEM_read32(anchor_3 + 1);
      if (offsetSaved_3 == 0 || UVar12 != UVar13) {
        if (uVar3 < uVar4) {
          UVar19 = MEM_read64(match_3);
          UVar20 = MEM_read64(anchor_3);
          if (UVar19 != UVar20) goto LAB_0072019b;
          sVar17 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar15);
          lStack_6c8 = sVar17 + 8;
          h2_3._4_4_ = iVar9 - (int)match_3;
          while( true ) {
            bVar21 = false;
            if (pBStack_638 < anchor_3 && pBVar14 < match_3) {
              bVar21 = anchor_3[-1] == match_3[-1];
            }
            if (!bVar21) break;
            anchor_3 = anchor_3 + -1;
            match_3 = match_3 + -1;
            lStack_6c8 = lStack_6c8 + 1;
          }
LAB_00720805:
          local_660 = offsetSaved_3;
          offsetSaved_3 = h2_3._4_4_;
          ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_638,pBStack_638,h2_3._4_4_ + 2,
                        lStack_6c8 - 3);
          goto LAB_00720855;
        }
LAB_0072019b:
        if (uVar3 < uVar5) {
          UVar12 = MEM_read32(pBStack_710);
          UVar13 = MEM_read32(anchor_3);
          if (UVar12 == UVar13) {
            sVar17 = ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            uVar4 = pUVar6[sVar17];
            pBStack_760 = pBVar8 + uVar4;
            pUVar6[sVar17] = uVar11 + 1;
            if (uVar3 < uVar4) {
              UVar19 = MEM_read64(pBStack_760);
              UVar20 = MEM_read64(anchor_3 + 1);
              if (UVar19 == UVar20) {
                sVar17 = ZSTD_count(anchor_3 + 9,pBStack_760 + 8,pBVar15);
                lStack_6c8 = sVar17 + 8;
                anchor_3 = anchor_3 + 1;
                h2_3._4_4_ = (int)anchor_3 - (int)pBStack_760;
                while( true ) {
                  bVar21 = false;
                  if (pBStack_638 < anchor_3 && pBVar14 < pBStack_760) {
                    bVar21 = anchor_3[-1] == pBStack_760[-1];
                  }
                  if (!bVar21) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_760 = pBStack_760 + -1;
                  lStack_6c8 = lStack_6c8 + 1;
                }
                goto LAB_00720805;
              }
            }
            sVar17 = ZSTD_count(anchor_3 + 4,pBStack_710 + 4,pBVar15);
            lStack_6c8 = sVar17 + 4;
            h2_3._4_4_ = iVar9 - (int)pBStack_710;
            while( true ) {
              bVar21 = false;
              if (pBStack_638 < anchor_3 && pBVar14 < pBStack_710) {
                bVar21 = anchor_3[-1] == pBStack_710[-1];
              }
              if (!bVar21) break;
              anchor_3 = anchor_3 + -1;
              pBStack_710 = pBStack_710 + -1;
              lStack_6c8 = lStack_6c8 + 1;
            }
            goto LAB_00720805;
          }
        }
        anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_638 >> 8) + 1;
      }
      else {
        sVar17 = ZSTD_count(anchor_3 + 5,anchor_3 + (5 - (ulong)offsetSaved_3),pBVar15);
        lStack_6c8 = sVar17 + 4;
        anchor_3 = anchor_3 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_638,pBStack_638,0,sVar17 + 1);
LAB_00720855:
        pBStack_638 = anchor_3 + lStack_6c8;
        anchor_3 = pBStack_638;
        if (pBStack_638 <= pBVar16) {
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar2,7);
          pUVar7[sVar17] = uVar11 + 2;
          sVar17 = ZSTD_hashPtr(pBVar8 + (ulong)uVar11 + 2,UVar1,8);
          pUVar6[sVar17] = uVar11 + 2;
          UVar12 = ((int)pBStack_638 + -2) - iVar10;
          sVar17 = ZSTD_hashPtr(pBStack_638 + -2,UVar2,7);
          pUVar7[sVar17] = UVar12;
          sVar17 = ZSTD_hashPtr(pBStack_638 + -2,UVar1,8);
          pUVar6[sVar17] = UVar12;
          while( true ) {
            uVar4 = local_660;
            bVar21 = false;
            if (anchor_3 <= pBVar16) {
              UVar12 = MEM_read32(anchor_3);
              UVar13 = MEM_read32(anchor_3 + -(ulong)local_660);
              bVar21 = local_660 != 0 && UVar12 == UVar13;
            }
            pBStack_638 = anchor_3;
            if (!bVar21) break;
            sVar17 = ZSTD_count(anchor_3 + 4,anchor_3 + (4 - (ulong)local_660),pBVar15);
            local_660 = offsetSaved_3;
            offsetSaved_3 = uVar4;
            sVar18 = ZSTD_hashPtr(anchor_3,UVar2,7);
            pUVar7[sVar18] = (int)anchor_3 - iVar10;
            sVar18 = ZSTD_hashPtr(anchor_3,UVar1,8);
            pUVar6[sVar18] = (int)anchor_3 - iVar10;
            ZSTD_storeSeq(seqStore,0,anchor_3,0,sVar17 + 1);
            anchor_3 = anchor_3 + sVar17 + 4;
          }
        }
      }
    }
    if (offsetSaved_3 == 0) {
      local_d00 = dms_3._4_4_;
    }
    else {
      local_d00 = offsetSaved_3;
    }
    *rep = local_d00;
    if (local_660 == 0) {
      local_d04 = dms_3._4_4_;
    }
    else {
      local_d04 = local_660;
    }
    rep[1] = local_d04;
    ms_local = (ZSTD_matchState_t *)(pBVar15 + -(long)pBStack_638);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}